

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.hpp
# Opt level: O2

void __thiscall xs::InfoMessage::~InfoMessage(InfoMessage *this)

{
  ~InfoMessage(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~InfoMessage		(void) {}